

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_bio.cc
# Opt level: O0

long anon_unknown.dwarf_2b::AsyncCtrl(BIO *bio,int cmd,long num,void *ptr)

{
  BIO *bp;
  long ret;
  BIO *next;
  void *ptr_local;
  long num_local;
  int cmd_local;
  BIO *bio_local;
  
  bp = BIO_next((BIO *)bio);
  if (bp == (BIO *)0x0) {
    bio_local = (BIO *)0x0;
  }
  else {
    BIO_clear_retry_flags(bio);
    bio_local = (BIO *)BIO_ctrl(bp,cmd,num,ptr);
    BIO_copy_next_retry((BIO *)bio);
  }
  return (long)bio_local;
}

Assistant:

static long AsyncCtrl(BIO *bio, int cmd, long num, void *ptr) {
  BIO *next = BIO_next(bio);
  if (next == nullptr) {
    return 0;
  }
  BIO_clear_retry_flags(bio);
  long ret = BIO_ctrl(next, cmd, num, ptr);
  BIO_copy_next_retry(bio);
  return ret;
}